

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::opendashblocks(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  
  requireDStackDepth(this,2,"OPEN-BLOCKS");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  savedashbuffers(this);
  emptydashbuffer(this);
  moveFromDataSpace(this,&this->blockFileName,src,(ulong)uVar1);
  return;
}

Assistant:

void opendashblocks() {
			REQUIRE_DSTACK_DEPTH(2, "OPEN-BLOCKS");
			auto size = dStack.getTop(); dStack.pop();
			auto address = dStack.getTop(); dStack.pop();
			flush();
			moveFromDataSpace(blockFileName, address, size);
		}